

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

int pmain(lua_State *L)

{
  uint uVar1;
  int iVar2;
  lua_Integer lVar3;
  int local_2c;
  int args;
  int script;
  char **argv;
  lua_State *plStack_18;
  int argc;
  lua_State *L_local;
  
  plStack_18 = L;
  lVar3 = lua_tointegerx(L,1,(int *)0x0);
  argv._4_4_ = (int)lVar3;
  _args = (char **)lua_touserdata(plStack_18,2);
  uVar1 = collectargs(_args,&local_2c);
  luaL_checkversion_(plStack_18,503.0,0x88);
  if ((*_args != (char *)0x0) && (**_args != '\0')) {
    progname = *_args;
  }
  if (uVar1 == 1) {
    print_usage(plStack_18,_args[local_2c]);
    L_local._4_4_ = 0;
  }
  else {
    if ((uVar1 & 4) != 0) {
      print_version(plStack_18);
    }
    if ((uVar1 & 0x10) != 0) {
      lua_pushboolean(plStack_18,1);
      lua_setfield(plStack_18,-0xf4628,"LUA_NOENV");
    }
    luaL_openlibs(plStack_18);
    luaL_requiref(plStack_18,"T",luaB_opentests,1);
    lua_settop(plStack_18,-2);
    createargtable(plStack_18,_args,argv._4_4_,local_2c);
    if (((uVar1 & 0x10) == 0) && (iVar2 = handle_luainit(plStack_18), iVar2 != 0)) {
      L_local._4_4_ = 0;
    }
    else {
      iVar2 = runargs(plStack_18,_args,local_2c);
      if (iVar2 == 0) {
        L_local._4_4_ = 0;
      }
      else if ((local_2c < argv._4_4_) &&
              (iVar2 = handle_script(plStack_18,_args + local_2c), iVar2 != 0)) {
        L_local._4_4_ = 0;
      }
      else {
        if ((uVar1 & 2) == 0) {
          if ((local_2c == argv._4_4_) && ((uVar1 & 0xc) == 0)) {
            print_version(plStack_18);
            doREPL(plStack_18);
          }
        }
        else {
          doREPL(plStack_18);
        }
        lua_pushboolean(plStack_18,1);
        L_local._4_4_ = 1;
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

static int pmain (lua_State *L) {
  int argc = (int)lua_tointeger(L, 1);
  char **argv = (char **)lua_touserdata(L, 2);
  int script;
  int args = collectargs(argv, &script);
  luaL_checkversion(L);  /* check that interpreter has correct version */
  if (argv[0] && argv[0][0]) progname = argv[0];
  if (args == has_error) {  /* bad arg? */
    print_usage(L, argv[script]);  /* 'script' has index of bad arg. */
    return 0;
  }
  if (args & has_v)  /* option '-v'? */
    print_version(L);
  if (args & has_E) {  /* option '-E'? */
    lua_pushboolean(L, 1);  /* signal for libraries to ignore env. vars. */
    lua_setfield(L, LUA_REGISTRYINDEX, "LUA_NOENV");
  }
  luaL_openlibs(L);  /* open standard libraries */
  createargtable(L, argv, argc, script);  /* create table 'arg' */
  //lua_gc(L, LUA_GCGEN, 0, 0);  /* GC in generational mode */
  if (!(args & has_E)) {  /* no option '-E'? */
    if (handle_luainit(L) != LUA_OK)  /* run LUA_INIT */
      return 0;  /* error running LUA_INIT */
  }
  if (!runargs(L, argv, script))  /* execute arguments -e and -l */
    return 0;  /* something failed */
  if (script < argc &&  /* execute main script (if there is one) */
      handle_script(L, argv + script) != LUA_OK)
    return 0;
  if (args & has_i)  /* -i option? */
    doREPL(L);  /* do read-eval-print loop */
  else if (script == argc && !(args & (has_e | has_v))) {  /* no arguments? */
    if (lua_stdin_is_tty()) {  /* running in interactive mode? */
      print_version(L);
      doREPL(L);  /* do read-eval-print loop */
    }
    else dofile(L, NULL);  /* executes stdin as a file */
  }
  lua_pushboolean(L, 1);  /* signal no errors */
  return 1;
}